

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

size_t __thiscall std::hash<wasm::Literal>::operator()(hash<wasm::Literal> *this,Literal *a)

{
  Type this_00;
  bool bVar1;
  BasicType BVar2;
  unsigned_long *puVar3;
  element_type *peVar4;
  value_type *other;
  int64_t local_e0;
  undefined1 local_d8 [8];
  value_type c;
  Iterator __end5;
  Iterator __begin5;
  Literals *__range5;
  Literal local_90;
  Literals *values;
  HeapType local_70;
  IString local_68;
  unsigned_long local_58;
  uint64_t chunks [2];
  int64_t local_40;
  int64_t local_38;
  int32_t local_30;
  int32_t local_2c;
  hash<wasm::Literal> *local_28;
  size_t digest;
  Literal *a_local;
  hash<wasm::Literal> *this_local;
  
  digest = (size_t)a;
  a_local = (Literal *)this;
  local_28 = (hash<wasm::Literal> *)::wasm::hash<wasm::Type>(&a->type);
  bVar1 = ::wasm::Type::isBasic((Type *)(digest + 0x10));
  if (!bVar1) {
    bVar1 = ::wasm::Type::isRef((Type *)(digest + 0x10));
    if (bVar1) {
      bVar1 = ::wasm::Literal::isNull((Literal *)digest);
      if (bVar1) {
        return (size_t)local_28;
      }
      bVar1 = ::wasm::Type::isFunction((Type *)(digest + 0x10));
      if (bVar1) {
        local_68.str = (string_view)::wasm::Literal::getFunc((Literal *)digest);
        ::wasm::rehash<wasm::Name>((size_t *)&local_28,(Name *)&local_68);
        return (size_t)local_28;
      }
      local_70 = ::wasm::Type::getHeapType((Type *)(digest + 0x10));
      values._4_4_ = 4;
      bVar1 = ::wasm::HeapType::operator==(&local_70,(BasicHeapType *)((long)&values + 4));
      if (bVar1) {
        values._0_4_ = ::wasm::Literal::geti31((Literal *)digest,true);
        ::wasm::rehash<int>((size_t *)&local_28,(int *)&values);
        return (size_t)local_28;
      }
      bVar1 = ::wasm::Type::isString((Type *)(digest + 0x10));
      if (bVar1) {
        ::wasm::Literal::getGCData(&local_90);
        peVar4 = __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_90);
        shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&local_90);
        local_90.type.id = (uintptr_t)&peVar4->values;
        __range5 = (Literals *)
                   ::wasm::SmallVector<wasm::Literal,_1UL>::size
                             (&(peVar4->values).super_SmallVector<wasm::Literal,_1UL>);
        ::wasm::rehash<unsigned_long>((size_t *)&local_28,(unsigned_long *)&__range5);
        this_00.id = local_90.type.id;
        join_0x00000010_0x00000000_ =
             (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              )::wasm::SmallVector<wasm::Literal,_1UL>::begin
                         ((SmallVector<wasm::Literal,_1UL> *)local_90.type.id);
        join_0x00000010_0x00000000_ =
             (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              )::wasm::SmallVector<wasm::Literal,_1UL>::end
                         ((SmallVector<wasm::Literal,_1UL> *)this_00.id);
        while (bVar1 = ::wasm::SmallVector<wasm::Literal,_1UL>::
                       IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                     *)&__end5.
                                        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                        .index,(Iterator *)&c.type), bVar1) {
          other = ::wasm::SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                            ((Iterator *)
                             &__end5.
                              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              .index);
          ::wasm::Literal::Literal((Literal *)local_d8,other);
          local_e0 = ::wasm::Literal::getInteger((Literal *)local_d8);
          ::wasm::rehash<long>((size_t *)&local_28,&local_e0);
          ::wasm::Literal::~Literal((Literal *)local_d8);
          ::wasm::SmallVector<wasm::Literal,_1UL>::
          IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
          ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                        *)&__end5.
                           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                           .index);
        }
        return (size_t)local_28;
      }
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                 ,0x311);
    }
    goto switchD_01598dee_default;
  }
  BVar2 = ::wasm::Type::getBasic((Type *)(digest + 0x10));
  switch(BVar2) {
  case none:
  case unreachable:
  default:
switchD_01598dee_default:
    ::wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
               ,0x313);
  case i32:
    local_2c = ::wasm::Literal::geti32((Literal *)digest);
    ::wasm::rehash<int>((size_t *)&local_28,&local_2c);
    this_local = local_28;
    break;
  case i64:
    local_38 = ::wasm::Literal::geti64((Literal *)digest);
    ::wasm::rehash<long>((size_t *)&local_28,&local_38);
    this_local = local_28;
    break;
  case f32:
    local_30 = ::wasm::Literal::reinterpreti32((Literal *)digest);
    ::wasm::rehash<int>((size_t *)&local_28,&local_30);
    this_local = local_28;
    break;
  case f64:
    local_40 = ::wasm::Literal::reinterpreti64((Literal *)digest);
    ::wasm::rehash<long>((size_t *)&local_28,&local_40);
    this_local = local_28;
    break;
  case v128:
    puVar3 = (unsigned_long *)::wasm::Literal::getv128Ptr((Literal *)digest);
    local_58 = *puVar3;
    chunks[0] = puVar3[1];
    ::wasm::rehash<unsigned_long>((size_t *)&local_28,&local_58);
    ::wasm::rehash<unsigned_long>((size_t *)&local_28,chunks);
    this_local = local_28;
  }
  return (size_t)this_local;
}

Assistant:

size_t operator()(const wasm::Literal& a) const {
    auto digest = wasm::hash(a.type);
    if (a.type.isBasic()) {
      switch (a.type.getBasic()) {
        case wasm::Type::i32:
          wasm::rehash(digest, a.geti32());
          return digest;
        case wasm::Type::f32:
          wasm::rehash(digest, a.reinterpreti32());
          return digest;
        case wasm::Type::i64:
          wasm::rehash(digest, a.geti64());
          return digest;
        case wasm::Type::f64:
          wasm::rehash(digest, a.reinterpreti64());
          return digest;
        case wasm::Type::v128:
          uint64_t chunks[2];
          memcpy(&chunks, a.getv128Ptr(), 16);
          wasm::rehash(digest, chunks[0]);
          wasm::rehash(digest, chunks[1]);
          return digest;
        case wasm::Type::none:
        case wasm::Type::unreachable:
          break;
      }
    } else if (a.type.isRef()) {
      if (a.isNull()) {
        return digest;
      }
      if (a.type.isFunction()) {
        wasm::rehash(digest, a.getFunc());
        return digest;
      }
      if (a.type.getHeapType() == wasm::HeapType::i31) {
        wasm::rehash(digest, a.geti31(true));
        return digest;
      }
      if (a.type.isString()) {
        auto& values = a.getGCData()->values;
        wasm::rehash(digest, values.size());
        for (auto c : values) {
          wasm::rehash(digest, c.getInteger());
        }
        return digest;
      }
      // other non-null reference type literals cannot represent concrete
      // values, i.e. there is no concrete anyref or eqref other than null.
      WASM_UNREACHABLE("unexpected type");
    }
    WASM_UNREACHABLE("unexpected type");
  }